

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation_tests.cpp
# Opt level: O0

void __thiscall txreconciliation_tests::ForgetPeerTest::test_method(ForgetPeerTest *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  NodeId peer_id0;
  TxReconciliationTracker tracker;
  char *in_stack_fffffffffffffcf8;
  lazy_ostream *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  NodeId in_stack_fffffffffffffd10;
  TxReconciliationTracker *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  lazy_ostream *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  unit_test_log_t *in_stack_fffffffffffffd38;
  unit_test_log_t *this_00;
  const_string local_228 [2];
  lazy_ostream local_208;
  const_string local_1b0 [2];
  lazy_ostream local_190 [2];
  lazy_ostream local_138;
  undefined1 local_120 [64];
  const_string local_e0 [2];
  lazy_ostream local_c0 [2];
  assertion_result local_a0 [2];
  lazy_ostream local_68;
  undefined1 local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TxReconciliationTracker::TxReconciliationTracker
            ((TxReconciliationTracker *)0xb9537e,
             (uint32_t)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  TxReconciliationTracker::PreRegisterPeer
            ((TxReconciliationTracker *)in_stack_fffffffffffffd08,(NodeId)in_stack_fffffffffffffd00)
  ;
  TxReconciliationTracker::ForgetPeer((TxReconciliationTracker *)in_stack_fffffffffffffcf8,0xb953b6)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd38,
               (const_string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (size_t)in_stack_fffffffffffffd28,
               (const_string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffd00,(char (*) [1])in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    local_68._vptr_lazy_ostream._4_4_ =
         TxReconciliationTracker::RegisterPeer
                   (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                    SUB81((ulong)in_stack_fffffffffffffd08 >> 0x38,0),
                    (uint32_t)in_stack_fffffffffffffd08,(uint64_t)in_stack_fffffffffffffd00);
    local_68._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffffd08 = "ReconciliationRegisterResult::NOT_FOUND";
    in_stack_fffffffffffffd00 = &local_68;
    in_stack_fffffffffffffcf8 = "tracker.RegisterPeer(peer_id0, true, 1, 1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
              (local_50,&local_68.m_empty,0x39,1,2,
               (undefined1 *)((long)&local_68._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxReconciliationTracker::PreRegisterPeer
            ((TxReconciliationTracker *)in_stack_fffffffffffffd08,(NodeId)in_stack_fffffffffffffd00)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd38,
               (const_string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (size_t)in_stack_fffffffffffffd28,
               (const_string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffffd08,
               (NodeId)in_stack_fffffffffffffd00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd08,
               SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffd00,(basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffcf8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a0,local_c0,local_e0,0x3d,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd38,
               (const_string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (size_t)in_stack_fffffffffffffd28,
               (const_string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffd00,(char (*) [1])in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    local_138._vptr_lazy_ostream._4_4_ =
         TxReconciliationTracker::RegisterPeer
                   (in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                    SUB81((ulong)in_stack_fffffffffffffd08 >> 0x38,0),
                    (uint32_t)in_stack_fffffffffffffd08,(uint64_t)in_stack_fffffffffffffd00);
    local_138._vptr_lazy_ostream._0_4_ = 1;
    in_stack_fffffffffffffd08 = "ReconciliationRegisterResult::SUCCESS";
    in_stack_fffffffffffffd00 = &local_138;
    in_stack_fffffffffffffcf8 = "tracker.RegisterPeer(peer_id0, true, 1, 1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ReconciliationRegisterResult,ReconciliationRegisterResult>
              (local_120,&local_138.m_empty,0x3e,2,2,
               (undefined1 *)((long)&local_138._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffcf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd38,
               (const_string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (size_t)in_stack_fffffffffffffd28,
               (const_string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    TxReconciliationTracker::IsPeerRegistered
              ((TxReconciliationTracker *)in_stack_fffffffffffffd08,
               (NodeId)in_stack_fffffffffffffd00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd08,
               SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffd00,(basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffcf8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe90,local_190,local_1b0,0x3f,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcf8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxReconciliationTracker::ForgetPeer((TxReconciliationTracker *)in_stack_fffffffffffffcf8,0xb95968)
  ;
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30)
               ,(size_t)in_stack_fffffffffffffd28,
               (const_string *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    in_stack_fffffffffffffd37 =
         TxReconciliationTracker::IsPeerRegistered
                   ((TxReconciliationTracker *)in_stack_fffffffffffffd08,
                    (NodeId)in_stack_fffffffffffffd00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffd08,
               SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0));
    in_stack_fffffffffffffd28 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffffd00,(basic_cstring<const_char> *)in_stack_fffffffffffffcf8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd08,
               (pointer)in_stack_fffffffffffffd00,(unsigned_long)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffcf8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe18,&local_208,local_228,0x41,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffcf8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffcf8);
    in_stack_fffffffffffffd27 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd27);
  TxReconciliationTracker::~TxReconciliationTracker
            ((TxReconciliationTracker *)in_stack_fffffffffffffcf8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ForgetPeerTest)
{
    TxReconciliationTracker tracker(TXRECONCILIATION_VERSION);
    NodeId peer_id0 = 0;

    // Removing peer after pre-registring works and does not let to register the peer.
    tracker.PreRegisterPeer(peer_id0);
    tracker.ForgetPeer(peer_id0);
    BOOST_CHECK_EQUAL(tracker.RegisterPeer(peer_id0, true, 1, 1), ReconciliationRegisterResult::NOT_FOUND);

    // Removing peer after it is registered works.
    tracker.PreRegisterPeer(peer_id0);
    BOOST_REQUIRE(!tracker.IsPeerRegistered(peer_id0));
    BOOST_REQUIRE_EQUAL(tracker.RegisterPeer(peer_id0, true, 1, 1), ReconciliationRegisterResult::SUCCESS);
    BOOST_CHECK(tracker.IsPeerRegistered(peer_id0));
    tracker.ForgetPeer(peer_id0);
    BOOST_CHECK(!tracker.IsPeerRegistered(peer_id0));
}